

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<int> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::getFd(PromiseClient *this)

{
  long in_RSI;
  
  if (*(char *)(in_RSI + 0x69) == '\x01') {
    (**(code **)(**(long **)(in_RSI + 0x48) + 0x28))(this);
  }
  else {
    *(undefined1 *)&(this->super_RpcClient).super_ClientHook._vptr_ClientHook = 0;
  }
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getFd() override {
      if (isResolved) {
        return cap->getFd();
      } else {
        // In theory, before resolution, the ImportClient for the promise could have an FD
        // attached, if the promise itself was presented with an attached FD. However, we can't
        // really return that one here because it may be closed when we get the Resolve message
        // later. In theory we could have the PromiseClient itself take ownership of an FD that
        // arrived attached to a promise cap, but the use case for that is questionable. I'm
        // keeping it simple for now.
        return kj::none;
      }
    }